

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SelfTestData::Clear(SelfTestData *this)

{
  InternalMetadata *this_00;
  uint32 cached_has_bits;
  SelfTestData *this_local;
  
  google::protobuf::internal::ExtensionSet::Clear(&this->_extensions_);
  google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::Clear(&this->samples_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if (((uint)this_00->ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
  }
  return;
}

Assistant:

void SelfTestData::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.SelfTestData)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  samples_.Clear();
  _internal_metadata_.Clear<std::string>();
}